

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CComputeBase::Run<glcts::(anonymous_namespace)::test_api::ES3>
          (CComputeBase *this)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  GLuint *buffers_00;
  GLuint *buffers_01;
  int iVar1;
  GLuint GVar2;
  GLint GVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar4;
  runtime_error *this_01;
  DrawElementsIndirectCommand *data;
  bool extraout_DL;
  bool extraout_DL_00;
  bool extraout_DL_01;
  bool linkAndCheck;
  size_t i;
  ulong uVar5;
  ES3 *pEVar6;
  GLsizeiptr GStackY_450;
  int height;
  int width;
  CColorArray bufferTest;
  CElementArray elements;
  CColorArray bufferRef1;
  CColorArray bufferRef2;
  CColorArray colors;
  CColorArray coords;
  CColorArray bufferRef4;
  CColorArray bufferRef3;
  DrawElementsIndirectCommand indirectElements;
  DrawArraysIndirectCommand indirectArrays;
  DILogger local_338;
  DIResult result;
  
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,0,&width);
  glu::CallLogWrapper::glGetIntegeri_v(this_00,0x91bf,1,&height);
  iVar1 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  if (*(int *)CONCAT44(extraout_var,iVar1) < width) {
    width = *(int *)CONCAT44(extraout_var,iVar1);
  }
  iVar1 = (*((this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  iVar1 = *(int *)(CONCAT44(extraout_var_00,iVar1) + 4);
  if (iVar1 < height) {
    height = iVar1;
  }
  glu::CallLogWrapper::glViewport(this_00,0,0,width,height);
  iVar1 = height * width;
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&result,0.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&coords,(long)iVar1,(value_type *)&result,(allocator_type *)&local_338);
  pEVar6 = (ES3 *)(long)(height * width);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&result,0.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&colors,(size_type)pEVar6,(value_type *)&result,(allocator_type *)&local_338);
  glcts::(anonymous_namespace)::test_api::ES3::glslVer_abi_cxx11_
            ((string *)&result,pEVar6,extraout_DL);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_338,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 "\nin vec4 in_coords;\nin vec4 in_colors;\nout vec4 colors;\nvoid main() {\n  colors = in_colors;\n  gl_Position = in_coords;\n#if defined(GL_ES)\n  gl_PointSize = 1.0;\n#endif\n}"
                );
  std::__cxx11::string::~string((string *)&result);
  pEVar6 = (ES3 *)(fixed_sample_locations_values + 1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&elements,fixed_sample_locations_values + 1,(allocator<char> *)&bufferRef2);
  glcts::(anonymous_namespace)::test_api::ES3::glslVer_abi_cxx11_
            ((string *)&result,pEVar6,extraout_DL_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bufferRef1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 "\nprecision highp float;\nin vec4 colors;\nout vec4 outColor;\nvoid main() {\n  outColor = colors;\n}"
                );
  std::__cxx11::string::~string((string *)&result);
  GVar2 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,(string *)&local_338,(string *)&elements,
                     (string *)&bufferRef1,false);
  this->_program = GVar2;
  std::__cxx11::string::~string((string *)&bufferRef1);
  std::__cxx11::string::~string((string *)&elements);
  std::__cxx11::string::~string((string *)&local_338);
  glu::CallLogWrapper::glBindAttribLocation(this_00,this->_program,0,"in_coords");
  glu::CallLogWrapper::glBindAttribLocation(this_00,this->_program,1,"in_colors");
  glu::CallLogWrapper::glLinkProgram(this_00,this->_program);
  lVar4 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_program);
  if (lVar4 == 0) {
    lVar4 = -1;
  }
  else {
    glu::CallLogWrapper::glUseProgram(this_00,this->_program);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->_vao);
    buffers = &this->_bufferCoords;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*buffers);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)coords.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(void *)0x0,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    buffers_00 = &this->_bufferColors;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers_00);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,*buffers_00);
    glu::CallLogWrapper::glBufferData
              (this_00,0x8892,
               (long)colors.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)colors.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(void *)0x0,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,1,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
    indirectElements.count = 0;
    indirectElements.primCount = 0;
    indirectElements.firstIndex = 0;
    indirectElements.baseVertex = 0;
    indirectElements.reservedMustBeZero = 0;
    indirectArrays.count = 0;
    indirectArrays.primCount = 0;
    indirectArrays.first = 0;
    indirectArrays.reservedMustBeZero = 0;
    result.logger_._0_8_ = (ulong)(uint)result.logger_._4_4_ << 0x20;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&elements,(long)(height * width),(value_type_conflict4 *)&result,
               (allocator_type *)&local_338);
    for (uVar5 = 0;
        uVar5 < (ulong)((long)elements.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)elements.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
      elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5] = (uint)uVar5;
    }
    buffers_01 = &this->_bufferIndirect;
    glu::CallLogWrapper::glGenBuffers(this_00,1,buffers_01);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,*buffers_01);
    if (this->_drawFunc == DRAW_ARRAYS) {
      data = (DrawElementsIndirectCommand *)&indirectArrays;
      GStackY_450 = 0x10;
    }
    else {
      if (this->_drawFunc != DRAW_ELEMENTS) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Unknown draw function!");
        goto LAB_00bc9be2;
      }
      glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_ebo);
      glu::CallLogWrapper::glBindBuffer(this_00,0x8893,this->_ebo);
      glu::CallLogWrapper::glBufferData
                (this_00,0x8893,
                 (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                 elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start,0x88e4);
      data = &indirectElements;
      GStackY_450 = 0x14;
    }
    pEVar6 = (ES3 *)0x8f3f;
    glu::CallLogWrapper::glBufferData(this_00,0x8f3f,GStackY_450,data,0x88e4);
    glcts::(anonymous_namespace)::test_api::ES3::glslVer_abi_cxx11_
              ((string *)&result,pEVar6,extraout_DL_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_338,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   "\nprecision highp int;                                           \nprecision highp float;                                         \n                                                               \nlayout(local_size_x = 1) in;                                   \nlayout(std430, binding = 0) buffer Vertices {                  \n    vec4 vertices[];                                           \n};                                                             \nlayout(std430, binding = 1) buffer Colors {                    \n    vec4 colors[];                                             \n};                                                             \nlayout(std430, binding = 2) buffer Indirect {                  \n    uint indirect[4];                                          \n};                                                             \n                                                               \nuniform uint height;                                           \nuniform uint width;                                            \n                                                               \nvoid main() {                                                  \n    uint w = gl_GlobalInvocationID.x;                          \n    uint h = gl_GlobalInvocationID.y;                          \n    float stepX = 2.0 / float(width);                          \n    float stepY = 2.0 / float(height);                         \n    float offsetX = -1.0 + stepX * float(w) + stepX / 2.0;     \n    float offsetY = -1.0 + stepY * float(h) + stepY / 2.0;     \n    uint arrayOffset = h * width + w;                          \n    vertices[ arrayOffset ] = vec4(offsetX, offsetY, 0.0, 1.0);\n    vec4 color = vec4(0.0, 0.0, 0.0, 1.0);                     \n    if(w > (width / 2u - 1u)) {                                \n        color = color + vec4(0.5, 0.0, 0.0, 0.0);              \n    }                                                          \n    if(h > (height / 2u - 1u)) {                               \n        color = color + vec4(0.0, 0.5, 0.0, 0.0);              ..." /* TRUNCATED STRING LITERAL */
                  );
    std::__cxx11::string::~string((string *)&result);
    GVar2 = DrawIndirectBase::CreateComputeProgram
                      (&this->super_DrawIndirectBase,(string *)&local_338,linkAndCheck);
    this->_programCompute = GVar2;
    std::__cxx11::string::~string((string *)&local_338);
    glu::CallLogWrapper::glLinkProgram(this_00,this->_programCompute);
    lVar4 = DrawIndirectBase::CheckProgram(&this->super_DrawIndirectBase,this->_programCompute);
    if (lVar4 == 0) {
      lVar4 = -1;
    }
    else {
      glu::CallLogWrapper::glUseProgram(this_00,this->_programCompute);
      GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->_programCompute,"width");
      glu::CallLogWrapper::glUniform1ui(this_00,GVar3,width);
      GVar3 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->_programCompute,"height");
      glu::CallLogWrapper::glUniform1ui(this_00,GVar3,height);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,*buffers);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,*buffers_00);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,*buffers_01);
      glu::CallLogWrapper::glDispatchCompute(this_00,width,height,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x2040);
      glu::CallLogWrapper::glUseProgram(this_00,this->_program);
      if (this->_drawFunc == DRAW_ELEMENTS) {
        glu::CallLogWrapper::glDrawElementsIndirect(this_00,0,0x1405,(void *)0x0);
      }
      else {
        if (this->_drawFunc != DRAW_ARRAYS) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_01,"Unknown draw function!");
LAB_00bc9be2:
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        glu::CallLogWrapper::glDrawArraysIndirect(this_00,0,(void *)0x0);
      }
      result.logger_.null_log_ = false;
      result.logger_._1_7_ = 0;
      result.logger_.str_.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x3f80000000000000;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&bufferRef1,(long)((height * width) / 4),(value_type *)&result,
                 (allocator_type *)&local_338);
      result.logger_.null_log_ = false;
      result.logger_._1_7_ = 0x3f0000;
      result.logger_.str_.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x3f80000000000000;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&bufferRef2,(long)((height * width) / 4),(value_type *)&result,
                 (allocator_type *)&local_338);
      result.logger_.null_log_ = false;
      result.logger_._1_7_ = 0x3f000000000000;
      result.logger_.str_.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x3f80000000000000;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&bufferRef3,(long)((height * width) / 4),(value_type *)&result,
                 (allocator_type *)&local_338);
      result.logger_._0_8_ = &DAT_3f0000003f000000;
      result.logger_.str_.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x3f80000000000000;
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&bufferRef4,(long)((height * width) / 4),(value_type *)&result,
                 (allocator_type *)&local_338);
      iVar1 = height * width;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&result,0.0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                (&bufferTest,(long)(iVar1 / 4),(value_type *)&result,(allocator_type *)&local_338);
      DIResult::DIResult(&result);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,0,0,width / 2,height / 2,
                 bufferTest.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar4 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&bufferTest,width / 2,height / 2,&bufferRef1,
                         width / 2,height / 2);
      DIResult::sub_result(&local_338,&result,lVar4);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_338,(char (*) [29])"Region 0 verification failed");
      DILogger::~DILogger(&local_338);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,(width + 1) / 2,0,width / 2,height / 2,
                 bufferTest.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar4 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&bufferTest,width / 2,height / 2,&bufferRef2,
                         width / 2,height / 2);
      DIResult::sub_result(&local_338,&result,lVar4);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_338,(char (*) [29])"Region 1 verification failed");
      DILogger::~DILogger(&local_338);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,0,(height + 1) / 2,width / 2,height / 2,
                 bufferTest.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      lVar4 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&bufferTest,width / 2,height / 2,&bufferRef3,
                         width / 2,height / 2);
      DIResult::sub_result(&local_338,&result,lVar4);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_338,(char (*) [29])"Region 2 verification failed");
      DILogger::~DILogger(&local_338);
      DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
                (&this->super_DrawIndirectBase,(width + 1) / 2,(height + 1) / 2,width / 2,height / 2
                 ,bufferTest.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      lVar4 = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                        ((DrawIndirectBase *)this,&bufferTest,width / 2,height / 2,&bufferRef4,
                         width / 2,height / 2);
      DIResult::sub_result(&local_338,&result,lVar4);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_338,(char (*) [29])"Region 3 verification failed");
      DILogger::~DILogger(&local_338);
      DILogger::~DILogger(&result.logger_);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&bufferTest.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&bufferRef4.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&bufferRef3.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&bufferRef2.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&bufferRef1.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      lVar4 = result.status_;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&colors.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&coords.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return lVar4;
}

Assistant:

long Run()
	{

		int width, height;
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 0, &width);
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, 1, &height);

		width  = std::min(width, getWindowWidth());
		height = std::min(height, getWindowHeight());

		glViewport(0, 0, width, height);

		CColorArray coords(width * height, tcu::Vec4(0));
		CColorArray colors(width * height, tcu::Vec4(0));

		_program = CreateProgram(Vsh<api>(), "", Fsh<api>(), false);
		glBindAttribLocation(_program, 0, "in_coords");
		glBindAttribLocation(_program, 1, "in_colors");
		glLinkProgram(_program);
		if (!CheckProgram(_program))
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);

		glGenBuffers(1, &_bufferCoords);
		glBindBuffer(GL_ARRAY_BUFFER, _bufferCoords);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), 0, GL_STREAM_DRAW);

		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(0);

		glGenBuffers(1, &_bufferColors);
		glBindBuffer(GL_ARRAY_BUFFER, _bufferColors);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(colors.size() * sizeof(colors[0])), 0, GL_STREAM_DRAW);

		glVertexAttribPointer(1, 4, GL_FLOAT, GL_FALSE, sizeof(tcu::Vec4), 0);
		glEnableVertexAttribArray(1);

		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };
		DrawArraysIndirectCommand   indirectArrays   = { 0, 0, 0, 0 };

		CElementArray elements(width * height, 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		glGenBuffers(1, &_bufferIndirect);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _bufferIndirect);
		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawArraysIndirectCommand), &indirectArrays, GL_STATIC_DRAW);
		}
		break;
		case DRAW_ELEMENTS:
		{
			glGenBuffers(1, &_ebo);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
						 GL_STATIC_DRAW);

			glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(DrawElementsIndirectCommand), &indirectElements,
						 GL_STATIC_DRAW);
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		_programCompute = CreateComputeProgram(Csh<api>(), false);
		glLinkProgram(_programCompute);
		if (!CheckProgram(_programCompute))
		{
			return ERROR;
		}
		glUseProgram(_programCompute);
		glUniform1ui(glGetUniformLocation(_programCompute, "width"), width);
		glUniform1ui(glGetUniformLocation(_programCompute, "height"), height);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, _bufferCoords);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, _bufferColors);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, _bufferIndirect);

		glDispatchCompute(width, height, 1);
		glMemoryBarrier(GL_COMMAND_BARRIER_BIT | GL_SHADER_STORAGE_BARRIER_BIT);

		glUseProgram(_program);

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			glDrawArraysIndirect(GL_POINTS, 0);
		}
		break;
		case DRAW_ELEMENTS:
		{
			glDrawElementsIndirect(GL_POINTS, GL_UNSIGNED_INT, 0);
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		CColorArray bufferRef1(width * height / 4, tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		CColorArray bufferRef2(width * height / 4, tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f));
		CColorArray bufferRef3(width * height / 4, tcu::Vec4(0.0f, 0.5f, 0.0f, 1.0f));
		CColorArray bufferRef4(width * height / 4, tcu::Vec4(0.5f, 0.5f, 0.0f, 1.0f));
		CColorArray bufferTest(width * height / 4, tcu::Vec4(0.0f));

		DIResult result;
		ReadPixelsFloat<api>(0, 0, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef1, width / 2, height / 2))
			<< "Region 0 verification failed";

		ReadPixelsFloat<api>((width + 1) / 2, 0, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef2, width / 2, height / 2))
			<< "Region 1 verification failed";

		ReadPixelsFloat<api>(0, (height + 1) / 2, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef3, width / 2, height / 2))
			<< "Region 2 verification failed";

		ReadPixelsFloat<api>((width + 1) / 2, (height + 1) / 2, width / 2, height / 2, &bufferTest[0]);
		result.sub_result(BuffersCompare(bufferTest, width / 2, height / 2, bufferRef4, width / 2, height / 2))
			<< "Region 3 verification failed";

		return result.code();
	}